

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgException.h
# Opt level: O0

void __thiscall
TCLAP::SpecificationException::SpecificationException
          (SpecificationException *this,string *text,string *id)

{
  allocator local_e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  allocator local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  allocator local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *id_local;
  string *text_local;
  SpecificationException *this_local;
  
  local_20 = id;
  id_local = text;
  text_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"Exception found when an Arg object ",&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"is improperly defined by the ",&local_b9);
  std::operator+(&local_60,&local_80,&local_b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"developer.",&local_e1);
  std::operator+(&local_40,&local_60,&local_e0);
  ArgException::ArgException(&this->super_ArgException,text,id,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  *(undefined ***)&this->super_ArgException = &PTR__SpecificationException_0018f8c0;
  return;
}

Assistant:

SpecificationException( const std::string& text = "undefined exception",
					            const std::string& id = "undefined" )
			: ArgException( text, 
			                id,
							std::string("Exception found when an Arg object ")+
							std::string("is improperly defined by the ") +
							std::string("developer." )) 
		{ }